

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,FieldAccess *field_access)

{
  int index_00;
  Value *pVVar1;
  string local_60;
  Symbol local_40;
  int local_1c;
  FieldAccess *pFStack_18;
  int index;
  FieldAccess *field_access_local;
  NewFunctionProcessingVisitor *this_local;
  
  pFStack_18 = field_access;
  field_access_local = (FieldAccess *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)&field_access->field_name_);
  Symbol::Symbol(&local_40,&local_60);
  index_00 = FunctionTable::Get(&this->table_,&local_40);
  Symbol::~Symbol(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_1c = index_00;
  pVVar1 = FrameEmulator::Get(&this->frame_,index_00);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar1;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(FieldAccess* field_access) {
  int index = table_.Get(Symbol(field_access->field_name_));
  tos_value_ = frame_.Get(index);
}